

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_test.cc
# Opt level: O1

void re2::RegexpSearchTests(void)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  StringPiece local_1b8;
  LogMessage local_1a8;
  
  iVar4 = 0;
  lVar5 = 8;
  do {
    local_1a8._0_8_ = *(undefined8 *)((long)&__dso_handle + lVar5);
    iVar2 = 0;
    if ((char *)local_1a8._0_8_ != (char *)0x0) {
      sVar3 = strlen((char *)local_1a8._0_8_);
      iVar2 = (int)sVar3;
    }
    local_1b8.ptr_ = *(char **)((long)&simple_tests + lVar5);
    local_1a8._8_4_ = iVar2;
    if (local_1b8.ptr_ == (char *)0x0) {
      local_1b8.length_ = 0;
    }
    else {
      sVar3 = strlen(local_1b8.ptr_);
      local_1b8.length_ = (int)sVar3;
    }
    bVar1 = TestRegexpOnText((StringPiece *)&local_1a8,&local_1b8);
    iVar4 = iVar4 + (uint)!bVar1;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0xea8);
  if (iVar4 != 0) {
    LogMessage::LogMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/search_test.cc"
               ,0x147,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1a8 + 8),"Check failed: (failures) == (0)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a8);
  }
  return;
}

Assistant:

TEST(Regexp, SearchTests) {
  int failures = 0;
  for (int i = 0; i < arraysize(simple_tests); i++) {
    const RegexpTest& t = simple_tests[i];
    if (!TestRegexpOnText(t.regexp, t.text))
      failures++;

#ifdef LOGGING
    // Build a dummy ExhaustiveTest call that will trigger just
    // this one test, so that we log the test case.
    vector<string> atom, alpha, ops;
    atom.push_back(StringPiece(t.regexp).as_string());
    alpha.push_back(StringPiece(t.text).as_string());
    ExhaustiveTest(1, 0, atom, ops, 1, alpha, "", "");
#endif

  }
  EXPECT_EQ(failures, 0);
}